

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

unique_ptr<CMipsInstruction,_std::default_delete<CMipsInstruction>_> __thiscall
MipsParser::parseOpcode(MipsParser *this,Parser *parser)

{
  uint uVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  Token *pTVar5;
  ulong uVar6;
  string *name;
  Parser *in_RDX;
  tMipsOpcode *opcode;
  
  pTVar5 = Parser::peekToken(in_RDX,0);
  if (pTVar5->type == Identifier) {
    pTVar5 = Parser::nextToken(in_RDX);
    uVar6 = (ulong)Mips.Version;
    name = &Token::identifierValue(pTVar5)->_name;
    bVar4 = false;
    for (opcode = MipsOpcodes; opcode->name != (char *)0x0; opcode = opcode + 1) {
      if (((((((mipsArchs[uVar6].supportSets & opcode->archs) != 0) &&
             ((mipsArchs[uVar6].excludeMask & opcode->archs) == 0)) &&
            ((uVar1 = opcode->flags, (uVar1 >> 0xc & 1) == 0 ||
             ((mipsArchs[uVar6].flags & 0x1000) != 0)))) &&
           (((uVar1 >> 0xd & 1) == 0 || ((mipsArchs[uVar6].flags & 0x2000) != 0)))) &&
          (((uVar1 >> 0xe & 1) == 0 || ((mipsArchs[uVar6].flags & 0x4000) != 0)))) &&
         (bVar3 = decodeOpcode((MipsParser *)parser,name,opcode), bVar3)) {
        p_Var2 = (((in_RDX->entries).
                   super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
        bVar4 = parseParameters((MipsParser *)parser,in_RDX,opcode);
        if (bVar4) {
          std::make_unique<CMipsInstruction,MipsOpcodeData&,MipsImmediateData&,MipsRegisterData&>
                    ((MipsOpcodeData *)this,
                     (MipsImmediateData *)
                     &parser[5].macros._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (MipsRegisterData *)
                     &parser[4].conditionStack.
                      super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          return (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>
                  )(__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>
                    )this;
        }
        (((in_RDX->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var2;
        bVar4 = true;
      }
    }
    if (bVar4) {
      Parser::printError<>(in_RDX,pTVar5,"MIPS parameter failure");
    }
    else {
      Parser::printError<Identifier>(in_RDX,pTVar5,"Invalid MIPS opcode \'%s\'",(Identifier *)name);
    }
  }
  *(undefined8 *)&(this->registers).grs = 0;
  return (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>)
         (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>)this;
}

Assistant:

std::unique_ptr<CMipsInstruction> MipsParser::parseOpcode(Parser& parser)
{
	if (parser.peekToken().type != TokenType::Identifier)
		return nullptr;

	const Token &token = parser.nextToken();

	bool paramFail = false;
	const MipsArchDefinition& arch = mipsArchs[Mips.GetVersion()];
	const Identifier &identifier = token.identifierValue();

	for (int z = 0; MipsOpcodes[z].name != nullptr; z++)
	{
		if ((MipsOpcodes[z].archs & arch.supportSets) == 0)
			continue;
		if ((MipsOpcodes[z].archs & arch.excludeMask) != 0)
			continue;

		if ((MipsOpcodes[z].flags & MO_64BIT) && !(arch.flags & MO_64BIT))
			continue;
		if ((MipsOpcodes[z].flags & MO_FPU) && !(arch.flags & MO_FPU))
			continue;
		if ((MipsOpcodes[z].flags & MO_DFPU) && !(arch.flags & MO_DFPU))
			continue;

		if (decodeOpcode(identifier.string(),MipsOpcodes[z]))
		{
			TokenizerPosition tokenPos = parser.getTokenizer()->getPosition();

			if (parseParameters(parser,MipsOpcodes[z]))
			{
				// success, return opcode
				return std::make_unique<CMipsInstruction>(opcodeData,immediate,registers);
			}

			parser.getTokenizer()->setPosition(tokenPos);
			paramFail = true;
		}
	}

	if (paramFail)
		parser.printError(token, "MIPS parameter failure");
	else
		parser.printError(token, "Invalid MIPS opcode '%s'",identifier);

	return nullptr;
}